

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Timing.cpp
# Opt level: O3

void __thiscall soul::ScopedTimer::ScopedTimer(ScopedTimer *this,string *desc)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  rep rVar5;
  
  paVar1 = &(this->description).field_2;
  (this->description)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (desc->_M_dataplus)._M_p;
  paVar2 = &desc->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&desc->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->description).field_2 + 8) = uVar4;
  }
  else {
    (this->description)._M_dataplus._M_p = pcVar3;
    (this->description).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->description)._M_string_length = desc->_M_string_length;
  (desc->_M_dataplus)._M_p = (pointer)paVar2;
  desc->_M_string_length = 0;
  (desc->field_2)._M_local_buf[0] = '\0';
  rVar5 = std::chrono::_V2::system_clock::now();
  (this->start).__d.__r = rVar5;
  return;
}

Assistant:

ScopedTimer::ScopedTimer (std::string desc) noexcept  : description (std::move (desc)) {}